

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.h
# Opt level: O2

string * getLitString_abi_cxx11_(int n)

{
  iterator iVar1;
  ostream *poVar2;
  uint in_ESI;
  char *pcVar3;
  string *in_RDI;
  stringstream ss;
  uint local_19c;
  allocator local_198 [16];
  ostream local_188 [376];
  
  if (lit_True.x != in_ESI) {
    if ((lit_False.x == in_ESI) || ((lit_True.x ^ in_ESI) == 1)) {
      pcVar3 = "false";
      goto LAB_0019635a;
    }
    if ((lit_False.x ^ in_ESI) != 1) {
      local_19c = in_ESI;
      iVar1 = std::
              _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&litString_abi_cxx11_._M_t,(key_type *)&local_19c);
      if ((_Rb_tree_header *)iVar1._M_node !=
          &litString_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::string((string *)in_RDI,(string *)&iVar1._M_node[1]._M_parent);
        return in_RDI;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_198);
      poVar2 = std::operator<<(local_188,"UNKNOWN_LITERAL (");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_19c);
      std::operator<<(poVar2,")");
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      return in_RDI;
    }
  }
  pcVar3 = "true";
LAB_0019635a:
  std::__cxx11::string::string((string *)in_RDI,pcVar3,local_198);
  return in_RDI;
}

Assistant:

inline std::string getLitString(int n) {
	if (n == toInt(lit_True)) {
		return "true";
	}
	if (n == toInt(lit_False)) {
		return "false";
	}
	if (n == toInt(~lit_True)) {
		return "false";
	}
	if (n == toInt(~lit_False)) {
		return "true";
	}
	const std::map<int, std::string>::const_iterator it = litString.find(n);
	if (it != litString.end()) {
		return it->second;
	}
	std::stringstream ss;
	ss << "UNKNOWN_LITERAL (" << n << ")";
	return ss.str();
}